

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

void * getOutputFile(int argc,char **argv)

{
  char *__s;
  _Alloc_hider _Var1;
  char cVar2;
  int iVar3;
  undefined8 in_RDX;
  undefined4 in_register_0000003c;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var4;
  _List _Var5;
  path local_e0;
  undefined1 local_b8 [8];
  path folder;
  ofstream *outFile;
  path outputFile;
  string outputFileName;
  
  outputFileName.field_2._8_8_ = in_RDX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Parsing  command line arguments....\n",0x24);
  outputFile._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )&outputFileName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputFile._M_cmpts,"out.cpp","");
  if (1 < (int)argv) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Arguments found...\n",0x13);
    _Var5._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )((ulong)argv & 0xffffffff);
    _Var4._M_head_impl = (_Impl *)0x1;
    folder._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         _Var5._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b8,
                 *(char **)(outputFileName.field_2._8_8_ + (long)_Var4._M_head_impl * 8),
                 (allocator<char> *)&outFile);
      iVar3 = std::__cxx11::string::compare((char *)local_b8);
      if (local_b8 != (undefined1  [8])&folder._M_pathname._M_string_length) {
        operator_delete((void *)local_b8,folder._M_pathname._M_string_length + 1);
      }
      _Var1._M_p = outputFileName._M_dataplus._M_p;
      if (iVar3 == 0) {
        __s = *(char **)(outputFileName.field_2._8_8_ + 8 + (long)_Var4._M_head_impl * 8);
        strlen(__s);
        _Var5 = folder._M_cmpts;
        std::__cxx11::string::_M_replace((ulong)&outputFile._M_cmpts,0,_Var1._M_p,(ulong)__s);
      }
      _Var4._M_head_impl = _Var4._M_head_impl + 1;
    } while (_Var5._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl !=
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )_Var4._M_head_impl);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Finished parsing command line arguments.\n",0x29);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_e0,(char (*) [12])"glom_output",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_b8,(path *)&outFile,&local_e0);
  std::filesystem::__cxx11::path::~path(&local_e0);
  std::filesystem::__cxx11::path::~path((path *)&outFile);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &outputFile._M_cmpts,auto_format);
  std::filesystem::__cxx11::operator/((path *)&outFile,(path *)local_b8,&local_e0);
  std::filesystem::__cxx11::path::~path(&local_e0);
  cVar2 = std::filesystem::status((path *)local_b8);
  if ((cVar2 == -1) || (cVar2 == '\0')) {
    std::filesystem::create_directory((path *)local_b8);
  }
  cVar2 = std::filesystem::status((path *)&outFile);
  if ((cVar2 != '\0') && (cVar2 != -1)) {
    std::filesystem::remove((path *)&outFile);
  }
  std::ofstream::ofstream((void *)CONCAT44(in_register_0000003c,argc),(char *)outFile,_S_out);
  std::filesystem::__cxx11::path::~path((path *)&outFile);
  std::filesystem::__cxx11::path::~path((path *)local_b8);
  if (outputFile._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl !=
      (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       )&outputFileName._M_string_length) {
    operator_delete((void *)outputFile._M_cmpts._M_impl._M_t.
                            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            .
                            super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                            ._M_head_impl,outputFileName._M_string_length + 1);
  }
  return (void *)CONCAT44(in_register_0000003c,argc);
}

Assistant:

std::ofstream getOutputFile(int argc, char** argv)
{
    std::cout << "Parsing  command line arguments....\n";
    std::string outputFileName = "out.cpp";
    if (argc > 1) {
        std::cout << "Arguments found...\n";
        for (int i = 1; i < argc; i++) {
            if (std::string(argv[i]) == "-o") {
                if (argc >= i + 1) {
                    outputFileName = argv[i + 1];
                }
            }
        }
    }
    std::cout << "Finished parsing command line arguments.\n";
    const auto folder = fs::current_path() / "glom_output";
    const auto outputFile = folder / outputFileName;

    if (!fs::exists(folder))
        fs::create_directory(folder);

    if (fs::exists(outputFile)) {
        fs::remove(outputFile);
    }

    std::ofstream outFile(outputFile);
    return outFile;
}